

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O3

void gimage::extractContours
               (vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *pl,ImageU8 *image,
               float tolerance)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  size_t __n;
  long lVar5;
  byte bVar6;
  long lVar7;
  byte bVar8;
  Polygon p;
  ImageU8 mask;
  Polygon local_88;
  vector<gimage::Polygon,_std::allocator<gimage::Polygon>_> *local_70;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_68;
  
  lVar5 = image->width;
  lVar3 = image->height;
  if (lVar3 < 1) {
    bVar8 = 0;
  }
  else {
    lVar4 = 0;
    bVar8 = 0;
    do {
      if (0 < lVar5) {
        lVar7 = 0;
        bVar6 = bVar8;
        do {
          bVar8 = (*image->img)[lVar4][lVar7];
          if ((*image->img)[lVar4][lVar7] < bVar6) {
            bVar8 = bVar6;
          }
          lVar7 = lVar7 + 1;
          bVar6 = bVar8;
        } while (lVar5 != lVar7);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar3);
  }
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (uchar *)0x0;
  local_68.row = (uchar **)0x0;
  local_68.img = (uchar ***)0x0;
  local_70 = pl;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(&local_68,lVar5,lVar3,1);
  __n = -local_68.n;
  if (0 < local_68.n) {
    __n = local_68.n;
  }
  memset(local_68.pixel,0,__n);
  lVar5 = image->height;
  if (0 < lVar5) {
    lVar3 = image->width;
    lVar4 = 0;
    do {
      if (0 < lVar3) {
        lVar5 = 0;
        bVar1 = false;
        do {
          local_88.vertex.
          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.vertex.
          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.vertex.
          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((*image->img)[lVar4][lVar5] == bVar8) {
            if ((!bVar1) && (bVar1 = true, (*local_68.img)[lVar4][lVar5] == '\0')) {
              extractContour(&local_88,&local_68,image,lVar5,lVar4,0);
              uVar2 = (long)local_88.vertex.
                            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88.vertex.
                            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              bVar1 = true;
              if ((0x20 < uVar2) &&
                 (lVar7 = *(long *)((long)local_88.vertex.
                                          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + (uVar2 - 0x10)
                                   ) -
                          (local_88.vertex.
                           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->v[0],
                 lVar3 = *(long *)((long)local_88.vertex.
                                         super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + (uVar2 - 8)) -
                         (local_88.vertex.
                          super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->v[1], bVar1 = true,
                 (ulong)(lVar3 * lVar3 + lVar7 * lVar7) < 3)) {
                if (0.0 <= tolerance) {
                  Polygon::reduce(&local_88,tolerance);
                }
                std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                          (local_70,&local_88);
              }
            }
          }
          else if (bVar1) {
            if ((*local_68.img)[lVar4][lVar5 + -1] == '\0') {
              extractContour(&local_88,&local_68,image,lVar5 + -1,lVar4,4);
              uVar2 = (long)local_88.vertex.
                            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88.vertex.
                            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if (uVar2 < 0x21) {
                bVar1 = false;
                goto LAB_00122941;
              }
              lVar7 = *(long *)((long)local_88.vertex.
                                      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar2 - 0x10)) -
                      (local_88.vertex.
                       super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->v[0];
              lVar3 = *(long *)((long)local_88.vertex.
                                      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (uVar2 - 8)) -
                      (local_88.vertex.
                       super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->v[1];
              if ((ulong)(lVar3 * lVar3 + lVar7 * lVar7) < 3) {
                if (0.0 <= tolerance) {
                  Polygon::reduce(&local_88,tolerance);
                }
                std::vector<gimage::Polygon,_std::allocator<gimage::Polygon>_>::push_back
                          (local_70,&local_88);
              }
            }
            bVar1 = false;
          }
LAB_00122941:
          if (local_88.vertex.
              super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.vertex.
                            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          lVar5 = lVar5 + 1;
          lVar3 = image->width;
        } while (lVar5 < lVar3);
        lVar5 = image->height;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar5);
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image(&local_68);
  return;
}

Assistant:

void extractContours(std::vector<Polygon> &pl, const ImageU8 &image, float tolerance)
{
  uint8_t fg=0;

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      fg=std::max(fg, image.get(i, k));
    }
  }

  ImageU8 mask(image.getWidth(), image.getHeight(), 1);
  mask.clear();

  for (long y=0; y<image.getHeight(); y++)
  {
    bool inside=false;
    for (long x=0; x<image.getWidth(); x++)
    {
      Polygon p;

      if (image.get(x, y) == fg && !inside)
      {
        if (mask.get(x, y) == 0)
        {
          extractContour(p, mask, image, x, y, 0);

          if (p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }

        inside=true;
      }
      else if (image.get(x, y) != fg && inside)
      {
        if (mask.get(x-1, y) == 0)
        {
          extractContour(p, mask, image, x-1, y, 4);

          if (p.isClosed())
          {
            if (tolerance >= 0)
            {
              p.reduce(tolerance);
            }

            pl.push_back(p);
          }
        }

        inside=false;
      }
    }
  }
}